

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

int pztopology::TPZTetrahedron::SideDimension(int side)

{
  ostream *this;
  void *this_00;
  int in_EDI;
  int local_4;
  
  if ((in_EDI < 0) || (0xe < in_EDI)) {
    this = std::operator<<((ostream *)&std::cerr,"TPZTetrahedron::SideDimension side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else {
    local_4 = *(int *)(pztopology::sidedimension + (long)in_EDI * 4);
  }
  return local_4;
}

Assistant:

int TPZTetrahedron::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "TPZTetrahedron::SideDimension side " << side << endl;
			return -1;
		}
		return sidedimension[side];
	}